

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::ZoneStackBase::_prepareBlock(ZoneStackBase *this,uint32_t side,size_t initialIndex)

{
  long lVar1;
  int line;
  void *pvVar2;
  char *msg;
  ulong uVar3;
  
  if (*(ZoneAllocator **)this == (ZoneAllocator *)0x0) {
    msg = "isInitialized()";
    line = 0x35;
  }
  else {
    uVar3 = (ulong)side;
    lVar1 = *(long *)(this + uVar3 * 8 + 8);
    if (*(long *)(lVar1 + 0x10) != *(long *)(lVar1 + 0x18)) {
      pvVar2 = ZoneAllocator::alloc(*(ZoneAllocator **)this,0x200);
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)pvVar2 + uVar3 * 8) = 0;
        *(long *)((long)pvVar2 + (ulong)(side == 0) * 8) = lVar1;
        *(size_t *)((long)pvVar2 + 0x10) = initialIndex + (long)pvVar2;
        *(size_t *)((long)pvVar2 + 0x18) = initialIndex + (long)pvVar2;
        *(void **)(lVar1 + uVar3 * 8) = pvVar2;
        *(void **)(this + uVar3 * 8 + 8) = pvVar2;
      }
      return (uint)(pvVar2 == (void *)0x0);
    }
    msg = "!prev->empty()";
    line = 0x38;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/zonestack.cpp"
             ,line,msg);
}

Assistant:

Error ZoneStackBase::_prepareBlock(uint32_t side, size_t initialIndex) noexcept {
  ASMJIT_ASSERT(isInitialized());

  Block* prev = _block[side];
  ASMJIT_ASSERT(!prev->empty());

  Block* block = _allocator->allocT<Block>(kBlockSize);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorOutOfMemory);

  block->_link[ side] = nullptr;
  block->_link[!side] = prev;
  block->_start = (uint8_t*)block + initialIndex;
  block->_end = (uint8_t*)block + initialIndex;

  prev->_link[side] = block;
  _block[side] = block;

  return kErrorOk;
}